

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> *
count_freqs(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
           uint32_t *ibuff,size_t isize,size_t *maxv)

{
  uint uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  pointer __s;
  size_t __n;
  pointer puVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  uint uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [32];
  
  __s = (pointer)operator_new(0x1000);
  puVar6 = __s + 0x400;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = __s;
  uVar10 = 0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar6;
  memset(__s,0,0x1000);
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = puVar6;
  if (isize == 0) {
    *maxv = 0;
  }
  else {
    sVar9 = 0;
    do {
      uVar7 = (long)puVar6 - (long)__s;
      uVar1 = ibuff[sVar9] + 1;
      if ((ulong)((long)uVar7 >> 2) <= (ulong)uVar1) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  (__return_storage_ptr__,(ulong)(ibuff[sVar9] + 2));
        __s = (__return_storage_ptr__->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
        puVar6 = (__return_storage_ptr__->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        __n = ((long)puVar6 - (long)__s) - uVar7;
        if (uVar7 <= (ulong)((long)puVar6 - (long)__s) && __n != 0) {
          memset((void *)(uVar7 + (long)__s),0,__n);
        }
      }
      if (uVar10 <= uVar1) {
        uVar10 = uVar1;
      }
      __s[uVar1] = __s[uVar1] + 1;
      sVar9 = sVar9 + 1;
    } while (isize != sVar9);
    *maxv = (ulong)uVar10;
    if (uVar10 != 0) {
      auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar18 = ZEXT1664((undefined1  [16])0x0);
      uVar7 = 2;
      if (2 < uVar10 + 1) {
        uVar7 = (ulong)(uVar10 + 1);
      }
      auVar14 = vpbroadcastq_avx512f();
      uVar8 = 0;
      do {
        auVar15 = vpbroadcastq_avx512f();
        auVar16 = vmovdqa64_avx512f(auVar18);
        auVar18 = vporq_avx512f(auVar15,auVar13);
        uVar5 = vpcmpuq_avx512f(auVar18,auVar14,2);
        auVar11 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(__s + uVar8 + 1));
        auVar12._4_4_ = (uint)((byte)(uVar5 >> 1) & 1) * auVar11._4_4_;
        auVar12._0_4_ = (uint)((byte)uVar5 & 1) * auVar11._0_4_;
        auVar12._8_4_ = (uint)((byte)(uVar5 >> 2) & 1) * auVar11._8_4_;
        auVar12._12_4_ = (uint)((byte)(uVar5 >> 3) & 1) * auVar11._12_4_;
        auVar12._16_4_ = (uint)((byte)(uVar5 >> 4) & 1) * auVar11._16_4_;
        auVar12._20_4_ = (uint)((byte)(uVar5 >> 5) & 1) * auVar11._20_4_;
        auVar12._24_4_ = (uint)((byte)(uVar5 >> 6) & 1) * auVar11._24_4_;
        auVar12._28_4_ = (uint)(byte)(uVar5 >> 7) * auVar11._28_4_;
        uVar8 = uVar8 + 8;
        auVar18 = vpmovzxdq_avx512f(auVar12);
        auVar18 = vpaddq_avx512f(auVar16,auVar18);
      } while ((uVar7 + 6 & 0xfffffffffffffff8) != uVar8);
      auVar18 = vmovdqa64_avx512f(auVar18);
      bVar2 = (bool)((byte)uVar5 & 1);
      auVar15._0_8_ = (ulong)bVar2 * auVar18._0_8_ | (ulong)!bVar2 * auVar16._0_8_;
      bVar2 = (bool)((byte)(uVar5 >> 1) & 1);
      auVar15._8_8_ = (ulong)bVar2 * auVar18._8_8_ | (ulong)!bVar2 * auVar16._8_8_;
      bVar2 = (bool)((byte)(uVar5 >> 2) & 1);
      auVar15._16_8_ = (ulong)bVar2 * auVar18._16_8_ | (ulong)!bVar2 * auVar16._16_8_;
      bVar2 = (bool)((byte)(uVar5 >> 3) & 1);
      auVar15._24_8_ = (ulong)bVar2 * auVar18._24_8_ | (ulong)!bVar2 * auVar16._24_8_;
      bVar2 = (bool)((byte)(uVar5 >> 4) & 1);
      auVar15._32_8_ = (ulong)bVar2 * auVar18._32_8_ | (ulong)!bVar2 * auVar16._32_8_;
      bVar2 = (bool)((byte)(uVar5 >> 5) & 1);
      auVar15._40_8_ = (ulong)bVar2 * auVar18._40_8_ | (ulong)!bVar2 * auVar16._40_8_;
      bVar2 = (bool)((byte)(uVar5 >> 6) & 1);
      auVar15._48_8_ = (ulong)bVar2 * auVar18._48_8_ | (ulong)!bVar2 * auVar16._48_8_;
      auVar15._56_8_ = (uVar5 >> 7) * auVar18._56_8_ | (ulong)!SUB81(uVar5 >> 7,0) * auVar16._56_8_;
      auVar11 = vextracti64x4_avx512f(auVar15,1);
      auVar18 = vpaddq_avx512f(auVar15,ZEXT3264(auVar11));
      auVar3 = vpaddq_avx(auVar18._0_16_,auVar18._16_16_);
      auVar4 = vpshufd_avx(auVar3,0xee);
      auVar3 = vpaddq_avx(auVar3,auVar4);
      if ((0x20000000000 < auVar3._0_8_) && (uVar10 != 0)) {
        puVar6 = (__return_storage_ptr__->
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        auVar11 = vpcmpeqd_avx2(ZEXT1632(auVar3),ZEXT1632(auVar3));
        do {
          auVar18 = ZEXT1664((undefined1  [16])0x0);
          uVar8 = 0;
          do {
            auVar15 = vpbroadcastq_avx512f();
            auVar16 = vmovdqa64_avx512f(auVar18);
            auVar18 = vporq_avx512f(auVar15,auVar13);
            uVar5 = vpcmpuq_avx512f(auVar18,auVar14,2);
            auVar12 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(puVar6 + uVar8 + 1));
            auVar19._4_4_ = (uint)((byte)(uVar5 >> 1) & 1) * auVar12._4_4_;
            auVar19._0_4_ = (uint)((byte)uVar5 & 1) * auVar12._0_4_;
            auVar19._8_4_ = (uint)((byte)(uVar5 >> 2) & 1) * auVar12._8_4_;
            auVar19._12_4_ = (uint)((byte)(uVar5 >> 3) & 1) * auVar12._12_4_;
            auVar19._16_4_ = (uint)((byte)(uVar5 >> 4) & 1) * auVar12._16_4_;
            auVar19._20_4_ = (uint)((byte)(uVar5 >> 5) & 1) * auVar12._20_4_;
            auVar19._24_4_ = (uint)((byte)(uVar5 >> 6) & 1) * auVar12._24_4_;
            auVar19._28_4_ = (uint)(byte)(uVar5 >> 7) * auVar12._28_4_;
            auVar12 = vpsubd_avx2(auVar19,auVar11);
            auVar19 = vpsrld_avx2(auVar12,1);
            auVar12 = vmovdqu32_avx512vl(auVar19);
            *(undefined1 (*) [32])(puVar6 + uVar8 + 1) = auVar12;
            auVar18 = vpmovzxdq_avx512f(auVar19);
            uVar8 = uVar8 + 8;
            auVar18 = vpaddq_avx512f(auVar16,auVar18);
          } while ((uVar7 + 6 & 0x1fffffff8) != uVar8);
          auVar18 = vmovdqa64_avx512f(auVar18);
          bVar2 = (bool)((byte)uVar5 & 1);
          auVar17._0_8_ = (ulong)bVar2 * auVar18._0_8_ | (ulong)!bVar2 * auVar16._0_8_;
          bVar2 = (bool)((byte)(uVar5 >> 1) & 1);
          auVar17._8_8_ = (ulong)bVar2 * auVar18._8_8_ | (ulong)!bVar2 * auVar16._8_8_;
          bVar2 = (bool)((byte)(uVar5 >> 2) & 1);
          auVar17._16_8_ = (ulong)bVar2 * auVar18._16_8_ | (ulong)!bVar2 * auVar16._16_8_;
          bVar2 = (bool)((byte)(uVar5 >> 3) & 1);
          auVar17._24_8_ = (ulong)bVar2 * auVar18._24_8_ | (ulong)!bVar2 * auVar16._24_8_;
          bVar2 = (bool)((byte)(uVar5 >> 4) & 1);
          auVar17._32_8_ = (ulong)bVar2 * auVar18._32_8_ | (ulong)!bVar2 * auVar16._32_8_;
          bVar2 = (bool)((byte)(uVar5 >> 5) & 1);
          auVar17._40_8_ = (ulong)bVar2 * auVar18._40_8_ | (ulong)!bVar2 * auVar16._40_8_;
          bVar2 = (bool)((byte)(uVar5 >> 6) & 1);
          auVar17._48_8_ = (ulong)bVar2 * auVar18._48_8_ | (ulong)!bVar2 * auVar16._48_8_;
          auVar17._56_8_ =
               (uVar5 >> 7) * auVar18._56_8_ | (ulong)!SUB81(uVar5 >> 7,0) * auVar16._56_8_;
          auVar12 = vextracti64x4_avx512f(auVar17,1);
          auVar18 = vpaddq_avx512f(auVar17,ZEXT3264(auVar12));
          auVar3 = vpaddq_avx(auVar18._0_16_,auVar18._16_16_);
          auVar4 = vpshufd_avx(auVar3,0xee);
          auVar3 = vpaddq_avx(auVar3,auVar4);
        } while ((0x20000000000 < auVar3._0_8_) && (uVar10 != 0));
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> count_freqs(
    const uint32_t* ibuff, size_t isize, size_t* maxv)
{
    uint32_t newmax = 0;
    std::vector<uint32_t> F(1024, 0);
    for (size_t i = 0; i < isize; i++) {
        uint32_t v = ibuff[i] + 1;
        if (v >= F.size()) {
            auto cur_size = F.size();
            F.resize(v + 1);
            for (size_t j = cur_size; j < F.size(); j++)
                F[j] = 0;
        }
        newmax = std::max(newmax, v);
        F[v]++;
    }
    *maxv = newmax;
    size_t total = 0;
    for (uint32_t i = 1; i <= newmax; i++) {
        total += F[i];
    }

    /* now downsample the frequency array if required, to ensure that
       total size is less than 2^28
    */
    while (total > MINR) {
        total = 0;
        for (uint32_t i = 1; i <= newmax; i++) {
            F[i] = (F[i] + 1) >> 1;
            total += F[i];
        }
    }
    /* return the array that got constructed */
    return F;
}